

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRMeshLoader.cpp
# Opt level: O1

void __thiscall
Assimp::IRRMeshImporter::InternReadFile
          (IRRMeshImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  aiColor4t<float> *paVar1;
  float *c_00;
  vector<char,_std::allocator<char>_> *pvVar2;
  undefined8 uVar3;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar4;
  pointer *ppaVar5;
  float fVar6;
  aiMaterial *paVar7;
  aiMesh *paVar8;
  IOStream *pIVar9;
  pointer __src;
  int iVar10;
  int iVar11;
  uint uVar12;
  undefined4 extraout_var;
  IrrXMLReader *pIVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Logger *pLVar14;
  undefined4 extraout_var_03;
  char *pcVar15;
  aiMesh *paVar16;
  undefined4 extraout_var_04;
  ulong *puVar17;
  pointer pbVar18;
  aiVector3D *paVar19;
  aiColor4D *paVar20;
  uint *puVar21;
  aiMesh **ppaVar22;
  aiMaterial **__dest;
  aiNode *this_00;
  runtime_error *prVar23;
  long *plVar24;
  undefined1 check_comma;
  Assimp AVar25;
  byte bVar26;
  uint uVar27;
  aiFace *paVar28;
  char *pcVar29;
  long *plVar30;
  long lVar31;
  Assimp *pAVar32;
  ulong uVar33;
  pointer paVar34;
  aiVector3D *paVar35;
  aiVector3D *paVar36;
  size_type __n;
  aiFace *paVar37;
  IrrlichtBase *this_01;
  float fVar38;
  float fVar39;
  aiVector3D temp;
  aiMaterial *curMat;
  aiMesh *curMesh;
  uint curMatFlags;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curVertices;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> materials;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> curColors;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  aiColor4D c;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curUV2s;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curUVs;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curBitangents;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curTangents;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curNormals;
  CIrrXML_IOStreamReader st;
  aiVector3t<float> local_234;
  aiMaterial *local_228;
  aiMesh *local_220;
  int local_214;
  aiMesh *local_210;
  uint local_204;
  ulong local_200;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_1f8;
  IOStream *local_1d8;
  uint local_1cc;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> local_1c8;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> local_1a8;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> local_188;
  undefined1 local_168 [8];
  undefined8 uStack_160;
  char local_158 [24];
  pointer local_140;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_138;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_118;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_f8;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_d8;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_b8;
  aiVector3D *local_98;
  aiColor4D *local_90;
  aiFace *local_88;
  pointer local_80;
  aiFace *local_78;
  CIrrXML_IOStreamReader local_70;
  aiVector3D *local_40;
  aiVector3D *local_38;
  
  pvVar2 = &local_70.data;
  pcVar29 = (char *)pIOHandler;
  local_70.super_IFileReadCallBack._vptr_IFileReadCallBack = (_func_int **)pvVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"rb","");
  iVar10 = (*pIOHandler->_vptr_IOSystem[4])
                     (pIOHandler,(pFile->_M_dataplus)._M_p,
                      local_70.super_IFileReadCallBack._vptr_IFileReadCallBack);
  local_1d8 = (IOStream *)CONCAT44(extraout_var,iVar10);
  if ((vector<char,_std::allocator<char>_> *)
      local_70.super_IFileReadCallBack._vptr_IFileReadCallBack != pvVar2) {
    operator_delete(local_70.super_IFileReadCallBack._vptr_IFileReadCallBack);
  }
  if (local_1d8 == (IOStream *)0x0) {
    prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                   "Failed to open IRRMESH file ",pFile);
    plVar24 = (long *)std::__cxx11::string::append(local_168);
    local_70.super_IFileReadCallBack._vptr_IFileReadCallBack = (_func_int **)*plVar24;
    plVar30 = plVar24 + 2;
    if (local_70.super_IFileReadCallBack._vptr_IFileReadCallBack == (_func_int **)plVar30) {
      local_70.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*plVar30;
      local_70.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)plVar24[3];
      local_70.super_IFileReadCallBack._vptr_IFileReadCallBack = (_func_int **)pvVar2;
    }
    else {
      local_70.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*plVar30;
    }
    local_70.stream = (IOStream *)plVar24[1];
    *plVar24 = (long)plVar30;
    plVar24[1] = 0;
    *(undefined1 *)(plVar24 + 2) = 0;
    std::runtime_error::runtime_error(prVar23,(string *)&local_70);
    *(undefined ***)prVar23 = &PTR__runtime_error_0081d260;
    __cxa_throw(prVar23,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(&local_70,local_1d8);
  pIVar13 = irr::io::createIrrXMLReader(&local_70.super_IFileReadCallBack);
  (this->super_IrrlichtBase).reader = pIVar13;
  local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiMaterial **)0x0;
  local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_start = (aiMaterial **)0x0;
  local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiMaterial **)0x0;
  local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (aiMesh **)0x0;
  local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (aiMesh **)0x0;
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::reserve(&local_1c8,5);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(&local_188,5);
  this_01 = &this->super_IrrlichtBase;
  local_228 = (aiMaterial *)0x0;
  local_220 = (aiMesh *)0x0;
  local_204 = 0;
  local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiColor4t<float> *)0x0;
  local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiColor4t<float> *)0x0;
  local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiColor4t<float> *)0x0;
  local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_200 = 0;
  local_214 = 0;
  iVar10 = 0;
LAB_00434d4f:
  do {
    while( true ) {
      iVar11 = (*this_01->reader->_vptr_IIrrXMLReader[2])();
      pIVar9 = local_1d8;
      if ((char)iVar11 == '\0') {
        if (local_228 != (aiMaterial *)0x0 || local_220 != (aiMesh *)0x0) {
          if (local_228 == (aiMaterial *)0x0 || local_220 == (aiMesh *)0x0) {
            pLVar14 = DefaultLogger::get();
            Logger::error(pLVar14,"IRRMESH: A buffer must contain a mesh and a material");
            paVar7 = local_228;
            if (local_228 != (aiMaterial *)0x0) {
              aiMaterial::~aiMaterial(local_228);
              operator_delete(paVar7);
              local_228 = (aiMaterial *)0x0;
            }
            paVar16 = local_220;
            if (local_220 != (aiMesh *)0x0) {
              aiMesh::~aiMesh(local_220);
              operator_delete(paVar16);
              local_220 = (aiMesh *)0x0;
            }
          }
          else {
            if (local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiMaterial*,std::allocator<aiMaterial*>>::
              _M_realloc_insert<aiMaterial*const&>
                        ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&local_1c8,
                         (iterator)
                         local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_228);
            }
            else {
              *local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
               super__Vector_impl_data._M_finish = local_228;
              local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            if (local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                        ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_188,
                         (iterator)
                         local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_220);
            }
            else {
              *local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish = local_220;
              local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
        }
        if (local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_168 = (undefined1  [8])local_158;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_168,"IRRMESH: Unable to read a mesh from this file","");
          std::runtime_error::runtime_error(prVar23,(string *)local_168);
          *(undefined ***)prVar23 = &PTR__runtime_error_0081d260;
          __cxa_throw(prVar23,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        pScene->mNumMeshes =
             (uint)((ulong)((long)local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3);
        ppaVar22 = (aiMesh **)
                   operator_new__((long)local_188.
                                        super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_188.
                                        super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                        _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8);
        __src = local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                super__Vector_impl_data._M_start;
        pScene->mMeshes = ppaVar22;
        if (pScene->mNumMeshes != 0) {
          uVar33 = 0;
          do {
            pScene->mMeshes[uVar33] =
                 local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar33];
            pScene->mMeshes[uVar33]->mNumUVComponents[3] = 0;
            uVar33 = uVar33 + 1;
          } while (uVar33 < pScene->mNumMeshes);
        }
        pScene->mNumMaterials =
             (uint)((ulong)((long)local_1c8.
                                  super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_1c8.
                                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3);
        uVar33 = (long)local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                       _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8;
        __dest = (aiMaterial **)operator_new__(uVar33);
        pScene->mMaterials = __dest;
        memcpy(__dest,__src,uVar33);
        this_00 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(this_00);
        pScene->mRootNode = this_00;
        (this_00->mName).length = 9;
        builtin_strncpy((this_00->mName).data,"<IRRMesh>",10);
        uVar12 = pScene->mNumMeshes;
        this_00->mNumMeshes = uVar12;
        puVar21 = (uint *)operator_new__((ulong)uVar12 << 2);
        this_00->mMeshes = puVar21;
        if (pScene->mNumMeshes != 0) {
          uVar33 = 0;
          do {
            pScene->mRootNode->mMeshes[uVar33] = (uint)uVar33;
            uVar33 = uVar33 + 1;
          } while (uVar33 < pScene->mNumMeshes);
        }
        if (this_01->reader != (IrrXMLReader *)0x0) {
          (*this_01->reader->_vptr_IIrrXMLReader[1])();
        }
        this_01->reader = (IrrXMLReader *)0x0;
        if ((aiMesh *)
            local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (aiMesh *)0x0) {
          operator_delete(local_138.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
          operator_delete(local_118.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (aiColor4t<float> *)0x0) {
          operator_delete(local_1a8.
                          super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
          operator_delete(local_f8.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
          operator_delete(local_d8.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
          operator_delete(local_b8.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
          operator_delete(local_1f8.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_start != (aiMaterial **)0x0) {
          operator_delete(local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        local_70.super_IFileReadCallBack._vptr_IFileReadCallBack =
             (_func_int **)&PTR__CIrrXML_IOStreamReader_0081f3f0;
        if (local_70.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_70.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        (*pIVar9->_vptr_IOStream[1])(pIVar9);
        return;
      }
      iVar11 = (*this_01->reader->_vptr_IIrrXMLReader[3])();
      if (iVar11 == 1) break;
      if (iVar11 == 3) {
        iVar11 = (*this_01->reader->_vptr_IIrrXMLReader[0xe])();
        pAVar32 = (Assimp *)CONCAT44(extraout_var_01,iVar11);
        if (iVar10 == 2) {
          paVar37 = local_220->mFaces;
          local_78 = paVar37 + *(uint *)&(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)&local_220->mNumFaces)->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start;
          local_80 = (pointer)local_220->mVertices;
          paVar19 = local_220->mTangents;
          pcVar29 = (char *)local_220->mBitangents;
          paVar20 = local_220->mColors[0];
          paVar35 = local_220->mTextureCoords[0];
          paVar36 = local_220->mTextureCoords[1];
          uVar12 = 0;
          local_1cc = 0;
          pbVar18 = (pointer)local_220->mNormals;
          local_210 = (aiMesh *)pcVar29;
LAB_00435cc8:
          for (; uVar33 = (ulong)(byte)*pAVar32, uVar33 < 0x21; pAVar32 = pAVar32 + 1) {
            pcVar29 = (char *)0x0;
            if ((0x100002600U >> (uVar33 & 0x3f) & 1) == 0) {
              if (uVar33 != 0) break;
              goto LAB_00436060;
            }
          }
          if (paVar37 < local_78) {
            local_98 = paVar35;
            local_90 = paVar20;
            local_38 = paVar36;
            if (uVar12 == 0) {
              local_140 = (pointer)((ulong)local_140 & 0xffffffff00000000);
              paVar37->mNumIndices = 3;
              puVar21 = (uint *)operator_new__(0xc);
              paVar37->mIndices = puVar21;
              uVar12 = (uint)local_140;
            }
            AVar25 = *pAVar32;
            uVar27 = 0;
            if (0xf5 < (byte)((char)AVar25 - 0x3aU)) {
              uVar27 = 0;
              do {
                uVar27 = (uint)(byte)((char)AVar25 - 0x30) + uVar27 * 10;
                AVar25 = pAVar32[1];
                pAVar32 = pAVar32 + 1;
              } while (0xf5 < (byte)((char)AVar25 - 0x3aU));
            }
            uVar33 = ((long)local_1f8.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_1f8.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
            local_88 = paVar37;
            local_40 = paVar19;
            if (uVar33 < uVar27 || uVar33 - uVar27 == 0) {
              pLVar14 = DefaultLogger::get();
              uVar27 = 0;
              Logger::error(pLVar14,"IRRMESH: Index out of range");
            }
            local_88->mIndices[uVar12] = local_1cc;
            paVar16 = (aiMesh *)(ulong)uVar27;
            *(float *)&local_80->_M_string_length =
                 local_1f8.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)paVar16].z;
            (local_80->_M_dataplus)._M_p =
                 *(pointer *)
                  (local_1f8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start + (long)paVar16);
            if (pbVar18 == (pointer)0x0) {
              local_140 = (pointer)0x0;
            }
            else {
              *(float *)&pbVar18->_M_string_length =
                   local_b8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)paVar16].z;
              (pbVar18->_M_dataplus)._M_p =
                   *(pointer *)
                    (local_b8.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + (long)paVar16);
              local_140 = (pointer)((long)&pbVar18->_M_string_length + 4);
            }
            if (local_40 == (aiVector3D *)0x0) {
              paVar19 = (aiVector3D *)0x0;
            }
            else {
              local_40->z = local_d8.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[(long)paVar16].z;
              fVar38 = local_d8.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[(long)paVar16].y;
              local_40->x = local_d8.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[(long)paVar16].x;
              local_40->y = fVar38;
              paVar19 = local_40 + 1;
            }
            if (local_210 == (aiMesh *)0x0) {
              local_210 = (aiMesh *)0x0;
            }
            else {
              *(float *)&(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_210->mNumFaces)->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start =
                   local_f8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)paVar16].z;
              fVar38 = local_f8.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[(long)paVar16].y;
              local_210->mPrimitiveTypes =
                   (uint)local_f8.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[(long)paVar16].x;
              local_210->mNumVertices = (uint)fVar38;
              local_210 = (aiMesh *)&local_210->field_0xc;
            }
            if (local_90 == (aiColor4D *)0x0) {
              paVar20 = (aiColor4D *)0x0;
              pcVar29 = (char *)paVar16;
            }
            else {
              paVar1 = local_1a8.
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start + (long)paVar16;
              fVar38 = paVar1->g;
              fVar39 = paVar1->b;
              fVar6 = paVar1->a;
              local_90->r = paVar1->r;
              local_90->g = fVar38;
              local_90->b = fVar39;
              local_90->a = fVar6;
              paVar20 = local_90 + 1;
              pcVar29 = (char *)((long)paVar16 * 0x10);
            }
            if (local_98 == (aiVector3D *)0x0) {
              paVar35 = (aiVector3D *)0x0;
            }
            else {
              local_98->z = local_118.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[(long)paVar16].z;
              pcVar29 = *(char **)(local_118.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + (long)paVar16);
              *(char **)&local_98->x = pcVar29;
              paVar35 = local_98 + 1;
            }
            if (local_38 == (aiVector3D *)0x0) {
              paVar36 = (aiVector3D *)0x0;
            }
            else {
              local_38->z = *(float *)((long)((long)local_138.
                                                                                                        
                                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 0x30)
                                      + (long)paVar16 * 0xc + -0x28);
              uVar3 = *(undefined8 *)
                       ((long)((long)local_138.
                                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 0x30) +
                       (long)paVar16 * 0xc + -0x30);
              local_38->x = (float)(int)uVar3;
              local_38->y = (float)(int)((ulong)uVar3 >> 0x20);
              paVar36 = local_38 + 1;
              pcVar29 = (char *)local_138.
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
            }
            local_1cc = local_1cc + 1;
            local_80 = (pointer)((long)&local_80->_M_string_length + 4);
            uVar27 = uVar12 + 1;
            uVar12 = uVar27;
            if (uVar27 == 3) {
              uVar12 = 0;
            }
            paVar37 = local_88 + (uVar27 == 3);
            pbVar18 = local_140;
            goto LAB_00435cc8;
          }
          pLVar14 = DefaultLogger::get();
          Logger::error(pLVar14,"IRRMESH: Too many indices");
LAB_00436060:
          if (paVar37 != local_78) {
            pLVar14 = DefaultLogger::get();
            Logger::error(pLVar14,"IRRMESH: Not enough indices");
          }
          iVar10 = 0;
          if (((local_204 & 1) != 0) && ((local_200 & 1) == 0)) {
            iVar10 = 0;
            pcVar29 = "$mat.opacity";
            aiMaterial::AddBinaryProperty
                      (local_228,
                       &(local_1a8.
                         super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start)->a,4,"$mat.opacity",0,0,
                       aiPTI_Float);
          }
        }
        else if (iVar10 == 1) {
LAB_00434e74:
          c_00 = &local_234.y;
          while( true ) {
            check_comma = SUB81(pcVar29,0);
            if (0x20 < (ulong)(byte)*pAVar32) break;
            pcVar29 = (char *)0x0;
            check_comma = false;
            if ((0x100002600U >> ((ulong)(byte)*pAVar32 & 0x3f) & 1) == 0) break;
            pAVar32 = pAVar32 + 1;
          }
          local_234.x = 0.0;
          local_234.y = 0.0;
          local_234.z = 0.0;
          local_168 = (undefined1  [8])0x0;
          uStack_160 = 0;
          for (pAVar32 = (Assimp *)
                         fast_atoreal_move<float>
                                   (pAVar32,(char *)&local_234,(float *)0x1,(bool)check_comma);
              (AVar25 = *pAVar32, AVar25 == (Assimp)0x20 || (AVar25 == (Assimp)0x9));
              pAVar32 = pAVar32 + 1) {
          }
          for (pAVar32 = (Assimp *)
                         fast_atoreal_move<float>(pAVar32,(char *)c_00,(float *)0x1,(bool)AVar25);
              (AVar25 = *pAVar32, AVar25 == (Assimp)0x20 || (AVar25 == (Assimp)0x9));
              pAVar32 = pAVar32 + 1) {
          }
          for (pAVar32 = (Assimp *)
                         fast_atoreal_move<float>
                                   (pAVar32,(char *)&local_234.z,(float *)0x1,(bool)AVar25);
              (*pAVar32 == (Assimp)0x20 || (*pAVar32 == (Assimp)0x9)); pAVar32 = pAVar32 + 1) {
          }
          if (local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>const&>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_1f8,
                       (iterator)
                       local_1f8.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_234);
          }
          else {
            (local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->z = local_234.z;
            (local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->x = local_234.x;
            (local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->y = local_234.y;
            local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_1f8.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          for (pAVar32 = (Assimp *)
                         fast_atoreal_move<float>
                                   (pAVar32,(char *)&local_234,(float *)0x1,(bool)AVar25);
              (AVar25 = *pAVar32, AVar25 == (Assimp)0x20 || (AVar25 == (Assimp)0x9));
              pAVar32 = pAVar32 + 1) {
          }
          for (pAVar32 = (Assimp *)
                         fast_atoreal_move<float>(pAVar32,(char *)c_00,(float *)0x1,(bool)AVar25);
              (AVar25 = *pAVar32, AVar25 == (Assimp)0x20 || (AVar25 == (Assimp)0x9));
              pAVar32 = pAVar32 + 1) {
          }
          for (pAVar32 = (Assimp *)
                         fast_atoreal_move<float>
                                   (pAVar32,(char *)&local_234.z,(float *)0x1,(bool)AVar25);
              (*pAVar32 == (Assimp)0x20 || (*pAVar32 == (Assimp)0x9)); pAVar32 = pAVar32 + 1) {
          }
          if (local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>const&>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_b8,
                       (iterator)
                       local_b8.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_234);
          }
          else {
            (local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->z = local_234.z;
            (local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->x = local_234.x;
            (local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->y = local_234.y;
            local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar12 = 0;
          do {
            AVar25 = *pAVar32;
            if ((byte)((char)AVar25 - 0x30U) < 10) {
              uVar12 = uVar12 << 4 | (uint)(byte)((char)AVar25 - 0x30U);
            }
            else {
              bVar26 = (char)AVar25 + 0xbf;
              if ((5 < bVar26) && (bVar26 = (char)AVar25 + 0x9f, 5 < bVar26)) goto LAB_00435040;
              uVar12 = uVar12 * 0x10 + (uint)bVar26 + 10;
            }
            pAVar32 = pAVar32 + 1;
          } while( true );
        }
      }
    }
    iVar11 = (*this_01->reader->_vptr_IIrrXMLReader[0xd])();
    if ((char *)CONCAT44(extraout_var_00,iVar11) == (char *)0x0) {
LAB_004363e4:
      __assert_fail("__null != s1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StringComparison.h"
                    ,0x8a,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
    }
    iVar11 = strcasecmp((char *)CONCAT44(extraout_var_00,iVar11),"buffer");
    if ((iVar11 == 0) && (local_228 != (aiMaterial *)0x0 || local_220 != (aiMesh *)0x0)) {
      if (local_228 == (aiMaterial *)0x0 || local_220 == (aiMesh *)0x0) {
        pLVar14 = DefaultLogger::get();
        Logger::error(pLVar14,"IRRMESH: A buffer must contain a mesh and a material");
        paVar7 = local_228;
        if (local_228 != (aiMaterial *)0x0) {
          aiMaterial::~aiMaterial(local_228);
          operator_delete(paVar7);
          local_228 = (aiMaterial *)0x0;
        }
        paVar16 = local_220;
        if (local_220 != (aiMesh *)0x0) {
          aiMesh::~aiMesh(local_220);
          operator_delete(paVar16);
        }
      }
      else {
        if (local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiMaterial*,std::allocator<aiMaterial*>>::_M_realloc_insert<aiMaterial*const&>
                    ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&local_1c8,
                     (iterator)
                     local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_228);
        }
        else {
          *local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_228;
          local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                    ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_188,
                     (iterator)
                     local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_220);
        }
        else {
          *local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_220;
          local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      local_228 = (aiMaterial *)0x0;
      local_220 = (aiMesh *)0x0;
      if (local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish =
             local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
          .super__Vector_impl_data._M_finish !=
          local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
          .super__Vector_impl_data._M_start) {
        local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish =
             local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish =
             local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
    }
    iVar11 = (*this_01->reader->_vptr_IIrrXMLReader[0xd])();
    if ((char *)CONCAT44(extraout_var_02,iVar11) == (char *)0x0) goto LAB_004363e4;
    iVar11 = strcasecmp((char *)CONCAT44(extraout_var_02,iVar11),"material");
    if (iVar11 == 0) {
      if (local_228 != (aiMaterial *)0x0) {
        pLVar14 = DefaultLogger::get();
        Logger::warn(pLVar14,"IRRMESH: Only one material description per buffer, please");
        paVar7 = local_228;
        if (local_228 != (aiMaterial *)0x0) {
          aiMaterial::~aiMaterial(local_228);
          operator_delete(paVar7);
          local_228 = (aiMaterial *)0x0;
        }
      }
      local_228 = IrrlichtBase::ParseMaterial(this_01,&local_204);
    }
    iVar11 = (*this_01->reader->_vptr_IIrrXMLReader[0xd])();
    if ((char *)CONCAT44(extraout_var_03,iVar11) == (char *)0x0) goto LAB_004363e4;
    iVar11 = strcasecmp((char *)CONCAT44(extraout_var_03,iVar11),"vertices");
    pcVar29 = (char *)this_01->reader->_vptr_IIrrXMLReader;
    if (iVar11 == 0) {
      iVar10 = (*(code *)((aiMesh *)pcVar29)->mColors[3])(this_01->reader,"vertexCount");
      if (iVar10 == 0) {
        pLVar14 = DefaultLogger::get();
        Logger::warn(pLVar14,"IRRMESH: Found mesh with zero vertices");
        paVar7 = local_228;
        if (local_228 != (aiMaterial *)0x0) {
          aiMaterial::~aiMaterial(local_228);
          operator_delete(paVar7);
          local_228 = (aiMaterial *)0x0;
        }
        paVar16 = local_220;
        iVar10 = 0;
        if (local_220 != (aiMesh *)0x0) {
          aiMesh::~aiMesh(local_220);
          operator_delete(paVar16);
          local_220 = (aiMesh *)0x0;
        }
      }
      else {
        __n = (size_type)iVar10;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&local_1f8,__n)
        ;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&local_b8,__n);
        std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::reserve(&local_1a8,__n);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&local_118,__n)
        ;
        iVar10 = (*this_01->reader->_vptr_IIrrXMLReader[8])(this_01->reader,"type");
        pcVar15 = (char *)CONCAT44(extraout_var_04,iVar10);
        if (pcVar15 == (char *)0x0) {
          __assert_fail("__null != s2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StringComparison.h"
                        ,0x8b,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
        }
        iVar10 = strcasecmp("2tcoords",pcVar15);
        if (iVar10 == 0) {
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                    (&local_138,__n);
          if ((local_204 >> 0x14 & 1) == 0) {
            local_214 = 1;
          }
          else {
            local_168._0_4_ = 1.4013e-45;
            uVar27 = 0;
            uVar12 = 10;
            if ((local_204 & 2) == 0) {
              local_214 = 1;
              uVar12 = 6;
              if ((local_204 >> 8 & 1) == 0) {
                uVar12 = 1;
                uVar27 = 1;
                if ((local_204 >> 0x10 & 1) == 0) goto LAB_0043603f;
              }
            }
            local_214 = 1;
            pcVar29 = "$tex.uvwsrc";
            aiMaterial::AddBinaryProperty
                      (local_228,local_168,4,"$tex.uvwsrc",uVar12,uVar27,aiPTI_Integer);
          }
LAB_0043603f:
          iVar10 = 1;
        }
        else {
          iVar10 = strcasecmp("tangents",pcVar15);
          if (iVar10 == 0) {
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                      (&local_d8,__n);
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                      (&local_f8,__n);
            iVar10 = 1;
            local_214 = 2;
          }
          else {
            iVar11 = strcasecmp("standard",pcVar15);
            paVar7 = local_228;
            iVar10 = 1;
            if (iVar11 == 0) {
              local_214 = 0;
            }
            else {
              if (local_228 != (aiMaterial *)0x0) {
                aiMaterial::~aiMaterial(local_228);
                operator_delete(paVar7);
                local_228 = (aiMaterial *)0x0;
              }
              pLVar14 = DefaultLogger::get();
              Logger::warn(pLVar14,"IRRMESH: Unknown vertex format");
            }
          }
        }
      }
      goto LAB_00434d4f;
    }
    pcVar15 = (char *)(*(code *)((aiMesh *)pcVar29)->mColors[7])();
    if (pcVar15 == (char *)0x0) goto LAB_004363e4;
    iVar11 = strcasecmp(pcVar15,"indices");
    if (iVar11 == 0) {
      if ((local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start ==
           local_1f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish) && (local_228 != (aiMaterial *)0x0)) {
        releaseMaterial(&local_228);
        prVar23 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_168 = (undefined1  [8])local_158;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_168,"IRRMESH: indices must come after vertices","");
        std::runtime_error::runtime_error(prVar23,(string *)local_168);
        *(undefined ***)prVar23 = &PTR__runtime_error_0081d260;
        __cxa_throw(prVar23,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      paVar16 = (aiMesh *)operator_new(0x520);
      paVar16->mPrimitiveTypes = 0;
      paVar16->mNumVertices = 0;
      *(undefined4 *)
       &(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&paVar16->mNumFaces)->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = 0;
      memset(&paVar16->mVertices,0,0xcc);
      paVar16->mBones = (aiBone **)0x0;
      paVar16->mMaterialIndex = 0;
      (paVar16->mName).length = 0;
      (paVar16->mName).data[0] = '\0';
      memset((paVar16->mName).data + 1,0x1b,0x3ff);
      paVar16->mNumAnimMeshes = 0;
      paVar16->mAnimMeshes = (aiAnimMesh **)0x0;
      paVar16->mMethod = 0;
      (paVar16->mAABB).mMin.x = 0.0;
      (paVar16->mAABB).mMin.y = 0.0;
      (paVar16->mAABB).mMin.z = 0.0;
      (paVar16->mAABB).mMax.x = 0.0;
      (paVar16->mAABB).mMax.y = 0.0;
      (paVar16->mAABB).mMax.z = 0.0;
      paVar16->mTextureCoords[0] = (aiVector3D *)0x0;
      paVar16->mTextureCoords[1] = (aiVector3D *)0x0;
      paVar16->mTextureCoords[2] = (aiVector3D *)0x0;
      paVar16->mTextureCoords[3] = (aiVector3D *)0x0;
      paVar16->mTextureCoords[4] = (aiVector3D *)0x0;
      paVar16->mTextureCoords[5] = (aiVector3D *)0x0;
      paVar16->mTextureCoords[6] = (aiVector3D *)0x0;
      paVar16->mTextureCoords[7] = (aiVector3D *)0x0;
      paVar16->mNumUVComponents[0] = 0;
      paVar16->mNumUVComponents[1] = 0;
      paVar16->mNumUVComponents[2] = 0;
      paVar16->mNumUVComponents[3] = 0;
      paVar16->mNumUVComponents[4] = 0;
      paVar16->mNumUVComponents[5] = 0;
      paVar16->mNumUVComponents[6] = 0;
      paVar16->mNumUVComponents[7] = 0;
      paVar16->mColors[0] = (aiColor4D *)0x0;
      paVar16->mColors[1] = (aiColor4D *)0x0;
      paVar16->mColors[2] = (aiColor4D *)0x0;
      paVar16->mColors[3] = (aiColor4D *)0x0;
      paVar16->mColors[4] = (aiColor4D *)0x0;
      paVar16->mColors[5] = (aiColor4D *)0x0;
      paVar16->mColors[6] = (aiColor4D *)0x0;
      paVar16->mColors[7] = (aiColor4D *)0x0;
      local_220 = paVar16;
      uVar12 = (*this_01->reader->_vptr_IIrrXMLReader[9])();
      local_220->mNumVertices = uVar12;
      if (local_220->mNumVertices == 0) {
        pcVar29 = (char *)local_220;
        pLVar14 = DefaultLogger::get();
        Logger::warn(pLVar14,"IRRMESH: Found mesh with zero indices");
        paVar16 = local_220;
        if (local_220 != (aiMesh *)0x0) {
          aiMesh::~aiMesh(local_220);
          operator_delete(paVar16);
          local_220 = (aiMesh *)0x0;
        }
        paVar7 = local_228;
        iVar10 = 0;
        if (local_228 != (aiMaterial *)0x0) {
          aiMaterial::~aiMaterial(local_228);
          operator_delete(paVar7);
          local_228 = (aiMaterial *)0x0;
        }
      }
      else {
        if (0x55555555 < local_220->mNumVertices * -0x55555555) {
          pLVar14 = DefaultLogger::get();
          Logger::warn(pLVar14,"IRRMESH: Number if indices isn\'t divisible by 3");
        }
        paVar16 = local_220;
        uVar12 = local_220->mNumVertices;
        uVar33 = (ulong)uVar12 / 3;
        *(uint *)&(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_220->mNumFaces)->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start = uVar12 / 3;
        puVar17 = (ulong *)operator_new__(uVar33 * 0x10 + 8);
        paVar8 = local_220;
        *puVar17 = uVar33;
        paVar37 = (aiFace *)(puVar17 + 1);
        if (2 < uVar12) {
          paVar28 = paVar37;
          do {
            paVar28->mNumIndices = 0;
            paVar28->mIndices = (uint *)0x0;
            paVar28 = paVar28 + 1;
          } while (paVar28 != paVar37 + uVar33);
        }
        paVar16->mFaces = paVar37;
        paVar16->mMaterialIndex =
             (uint)((ulong)((long)local_1c8.
                                  super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_1c8.
                                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3);
        paVar16->mPrimitiveTypes = 4;
        uVar33 = (ulong)local_220->mNumVertices;
        pbVar18 = (pointer)operator_new__(uVar33 * 0xc);
        if (uVar33 != 0) {
          memset(pbVar18,0,((uVar33 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar8->mVertices = (aiVector3D *)pbVar18;
        lVar31 = (long)local_1f8.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_1f8.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        if ((long)local_b8.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start == lVar31) {
          uVar33 = (ulong)paVar8->mNumVertices;
          pbVar18 = (pointer)operator_new__(uVar33 * 0xc);
          if (uVar33 != 0) {
            memset(pbVar18,0,((uVar33 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar8->mNormals = (aiVector3D *)pbVar18;
        }
        if ((long)local_d8.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_d8.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start == lVar31) {
          uVar33 = (ulong)paVar8->mNumVertices;
          paVar19 = (aiVector3D *)operator_new__(uVar33 * 0xc);
          if (uVar33 != 0) {
            memset(paVar19,0,((uVar33 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar8->mTangents = paVar19;
        }
        if ((long)local_f8.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_f8.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start == lVar31) {
          uVar33 = (ulong)paVar8->mNumVertices;
          paVar19 = (aiVector3D *)operator_new__(uVar33 * 0xc);
          if (uVar33 != 0) {
            memset(paVar19,0,((uVar33 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar8->mBitangents = paVar19;
        }
        pcVar29 = (char *)((long)local_1a8.
                                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_1a8.
                                 super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4);
        if (((aiMesh *)pcVar29 == (aiMesh *)((lVar31 >> 2) * -0x5555555555555555)) &&
           ((local_200 & 1) != 0)) {
          uVar12 = paVar8->mNumVertices;
          uVar33 = (ulong)uVar12 << 4;
          paVar20 = (aiColor4D *)operator_new__(uVar33);
          if ((ulong)uVar12 != 0) {
            memset(paVar20,0,uVar33);
          }
          paVar8->mColors[0] = paVar20;
        }
        if ((long)local_118.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_118.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start == lVar31) {
          uVar33 = (ulong)paVar8->mNumVertices;
          paVar19 = (aiVector3D *)operator_new__(uVar33 * 0xc);
          if (uVar33 != 0) {
            pcVar29 = (char *)0xaaaaaaaaaaaaaaab;
            memset(paVar19,0,((uVar33 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar8->mTextureCoords[0] = paVar19;
        }
        iVar10 = 2;
        if ((long)local_138.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_138.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start == lVar31) {
          uVar33 = (ulong)paVar8->mNumVertices;
          paVar19 = (aiVector3D *)operator_new__(uVar33 * 0xc);
          if (uVar33 != 0) {
            pcVar29 = (char *)0xaaaaaaaaaaaaaaab;
            memset(paVar19,0,((uVar33 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar8->mTextureCoords[1] = paVar19;
        }
      }
    }
  } while( true );
LAB_00435040:
  fVar38 = (float)(uVar12 >> 0x18) / 255.0;
  local_168._0_4_ = (float)(uVar12 >> 0x10 & 0xff) / 255.0;
  uVar27 = uVar12 >> 8 & 0xff;
  uVar33 = (ulong)uVar27;
  local_168._4_4_ = (float)uVar27 / 255.0;
  fVar39 = (float)(uVar12 & 0xff) / 255.0;
  uStack_160 = CONCAT44(fVar38,fVar39);
  if (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_210 = (aiMesh *)CONCAT44(local_210._4_4_,(int)local_200);
  }
  else {
    local_210 = (aiMesh *)CONCAT44(local_210._4_4_,1);
    if (((float)local_168._0_4_ ==
         local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].r) &&
       (!NAN((float)local_168._0_4_) &&
        !NAN(local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish[-1].r))) {
      if (((float)local_168._4_4_ ==
           local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish[-1].g) &&
         (!NAN((float)local_168._4_4_) &&
          !NAN(local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish[-1].g))) {
        if ((fVar39 == local_1a8.
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1].b) &&
           (!NAN(fVar39) &&
            !NAN(local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish[-1].b))) {
          uVar12 = (uint)(byte)local_200;
          if (fVar38 != local_1a8.
                        super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].a) {
            uVar12 = 1;
          }
          if (NAN(fVar38) ||
              NAN(local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].a)) {
            uVar12 = 1;
          }
          uVar33 = (ulong)uVar12;
          local_210 = (aiMesh *)CONCAT44(local_210._4_4_,uVar12);
        }
      }
    }
  }
  if (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
    _M_realloc_insert<aiColor4t<float>const&>
              ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)&local_1a8,
               (iterator)
               local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,(aiColor4t<float> *)local_168);
  }
  else {
    (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->r = (float)local_168._0_4_;
    (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->g = (float)local_168._4_4_;
    (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->b = fVar39;
    (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->a = fVar38;
    local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  for (; (*pAVar32 == (Assimp)0x20 || (*pAVar32 == (Assimp)0x9)); pAVar32 = pAVar32 + 1) {
  }
  for (pAVar32 = (Assimp *)
                 fast_atoreal_move<float>(pAVar32,(char *)&local_234,(float *)0x1,SUB81(uVar33,0));
      (AVar25 = *pAVar32, AVar25 == (Assimp)0x20 || (AVar25 == (Assimp)0x9)); pAVar32 = pAVar32 + 1)
  {
  }
  for (pAVar32 = (Assimp *)fast_atoreal_move<float>(pAVar32,(char *)c_00,(float *)0x1,(bool)AVar25);
      (*pAVar32 == (Assimp)0x20 || (*pAVar32 == (Assimp)0x9)); pAVar32 = pAVar32 + 1) {
  }
  local_234.z = 0.0;
  fVar38 = 1.0 - local_234.y;
  local_234.y = fVar38;
  if (local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_118,
               (iterator)
               local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_234);
  }
  else {
    (local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->z = 0.0;
    (local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->x = local_234.x;
    (local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->y = fVar38;
    local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_214 == 1) {
    for (pAVar32 = (Assimp *)
                   fast_atoreal_move<float>(pAVar32,(char *)&local_234,(float *)0x1,(bool)AVar25);
        (AVar25 = *pAVar32, AVar25 == (Assimp)0x20 || (AVar25 == (Assimp)0x9));
        pAVar32 = pAVar32 + 1) {
    }
    pAVar32 = (Assimp *)fast_atoreal_move<float>(pAVar32,(char *)c_00,(float *)0x1,(bool)AVar25);
    local_234.y = 1.0 - local_234.y;
    if (local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish ==
        local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_138,
                 (iterator)
                 local_138.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_234);
      goto LAB_004353ff;
    }
    pvVar4 = &local_138;
    paVar34 = local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    if (local_214 != 2) goto LAB_004353ff;
    for (pAVar32 = (Assimp *)
                   fast_atoreal_move<float>(pAVar32,(char *)&local_234,(float *)0x1,(bool)AVar25);
        (AVar25 = *pAVar32, AVar25 == (Assimp)0x20 || (AVar25 == (Assimp)0x9));
        pAVar32 = pAVar32 + 1) {
    }
    for (pAVar32 = (Assimp *)
                   fast_atoreal_move<float>(pAVar32,(char *)&local_234.z,(float *)0x1,(bool)AVar25);
        (AVar25 = *pAVar32, AVar25 == (Assimp)0x20 || (AVar25 == (Assimp)0x9));
        pAVar32 = pAVar32 + 1) {
    }
    for (pAVar32 = (Assimp *)
                   fast_atoreal_move<float>(pAVar32,(char *)c_00,(float *)0x1,(bool)AVar25);
        (*pAVar32 == (Assimp)0x20 || (*pAVar32 == (Assimp)0x9)); pAVar32 = pAVar32 + 1) {
    }
    local_234._0_8_ = local_234._0_8_ ^ 0x8000000000000000;
    if (local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_d8,
                 (iterator)
                 local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_234);
    }
    else {
      (local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish)->z = local_234.z;
      (local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish)->x = local_234.x;
      (local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish)->y = local_234.y;
      local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    for (pAVar32 = (Assimp *)
                   fast_atoreal_move<float>(pAVar32,(char *)&local_234,(float *)0x1,(bool)AVar25);
        (AVar25 = *pAVar32, AVar25 == (Assimp)0x20 || (AVar25 == (Assimp)0x9));
        pAVar32 = pAVar32 + 1) {
    }
    for (pAVar32 = (Assimp *)
                   fast_atoreal_move<float>(pAVar32,(char *)&local_234.z,(float *)0x1,(bool)AVar25);
        (AVar25 = *pAVar32, AVar25 == (Assimp)0x20 || (AVar25 == (Assimp)0x9));
        pAVar32 = pAVar32 + 1) {
    }
    for (pAVar32 = (Assimp *)
                   fast_atoreal_move<float>(pAVar32,(char *)c_00,(float *)0x1,(bool)AVar25);
        (*pAVar32 == (Assimp)0x20 || (*pAVar32 == (Assimp)0x9)); pAVar32 = pAVar32 + 1) {
    }
    local_234._0_8_ = local_234._0_8_ ^ 0x8000000000000000;
    if (local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_f8,
                 (iterator)
                 local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_234);
      goto LAB_004353ff;
    }
    pvVar4 = &local_f8;
    paVar34 = local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  ppaVar5 = &(pvVar4->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  paVar34->z = local_234.z;
  paVar34->x = local_234.x;
  paVar34->y = local_234.y;
  *ppaVar5 = *ppaVar5 + 1;
LAB_004353ff:
  while ((0xd < (byte)*pAVar32 ||
         (pcVar29 = (char *)0x2401, (0x2401U >> ((byte)*pAVar32 & 0x1f) & 1) == 0))) {
    pAVar32 = pAVar32 + 1;
  }
  for (; (AVar25 = *pAVar32, AVar25 == (Assimp)0xa || (AVar25 == (Assimp)0xd));
      pAVar32 = pAVar32 + 1) {
  }
  if (AVar25 == (Assimp)0x0) goto LAB_00435f60;
  local_200 = (ulong)local_210 & 0xffffffff;
  goto LAB_00434e74;
LAB_00435f60:
  iVar10 = 0;
  local_200 = (ulong)local_210 & 0xffffffff;
  goto LAB_00434d4f;
}

Assistant:

void IRRMeshImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open IRRMESH file " + pFile + "");

    // Construct the irrXML parser
    CIrrXML_IOStreamReader st(file.get());
    reader = createIrrXMLReader((IFileReadCallBack*) &st);

    // final data
    std::vector<aiMaterial*> materials;
    std::vector<aiMesh*>     meshes;
    materials.reserve (5);
    meshes.reserve(5);

    // temporary data - current mesh buffer
    aiMaterial* curMat  = nullptr;
    aiMesh* curMesh     = nullptr;
    unsigned int curMatFlags = 0;

    std::vector<aiVector3D> curVertices,curNormals,curTangents,curBitangents;
    std::vector<aiColor4D>  curColors;
    std::vector<aiVector3D> curUVs,curUV2s;

    // some temporary variables
    int textMeaning = 0;
    int vertexFormat = 0; // 0 = normal; 1 = 2 tcoords, 2 = tangents
    bool useColors = false;

    // Parse the XML file
    while (reader->read())  {
        switch (reader->getNodeType())  {
        case EXN_ELEMENT:

            if (!ASSIMP_stricmp(reader->getNodeName(),"buffer") && (curMat || curMesh)) {
                // end of previous buffer. A material and a mesh should be there
                if ( !curMat || !curMesh)   {
                    ASSIMP_LOG_ERROR("IRRMESH: A buffer must contain a mesh and a material");
                    releaseMaterial( &curMat );
                    releaseMesh( &curMesh );
                } else {
                    materials.push_back(curMat);
                    meshes.push_back(curMesh);
                }
                curMat  = nullptr;
                curMesh = nullptr;

                curVertices.clear();
                curColors.clear();
                curNormals.clear();
                curUV2s.clear();
                curUVs.clear();
                curTangents.clear();
                curBitangents.clear();
            }


            if (!ASSIMP_stricmp(reader->getNodeName(),"material"))  {
                if (curMat) {
                    ASSIMP_LOG_WARN("IRRMESH: Only one material description per buffer, please");
                    releaseMaterial( &curMat );
                }
                curMat = ParseMaterial(curMatFlags);
            }
            /* no else here! */ if (!ASSIMP_stricmp(reader->getNodeName(),"vertices"))
            {
                int num = reader->getAttributeValueAsInt("vertexCount");

                if (!num)   {
                    // This is possible ... remove the mesh from the list and skip further reading
                    ASSIMP_LOG_WARN("IRRMESH: Found mesh with zero vertices");

                    releaseMaterial( &curMat );
                    releaseMesh( &curMesh );
                    textMeaning = 0;
                    continue;
                }

                curVertices.reserve(num);
                curNormals.reserve(num);
                curColors.reserve(num);
                curUVs.reserve(num);

                // Determine the file format
                const char* t = reader->getAttributeValueSafe("type");
                if (!ASSIMP_stricmp("2tcoords", t)) {
                    curUV2s.reserve (num);
                    vertexFormat = 1;

                    if (curMatFlags & AI_IRRMESH_EXTRA_2ND_TEXTURE) {
                        // *********************************************************
                        // We have a second texture! So use this UV channel
                        // for it. The 2nd texture can be either a normal
                        // texture (solid_2layer or lightmap_xxx) or a normal
                        // map (normal_..., parallax_...)
                        // *********************************************************
                        int idx = 1;
                        aiMaterial* mat = ( aiMaterial* ) curMat;

                        if (curMatFlags & AI_IRRMESH_MAT_lightmap){
                            mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_LIGHTMAP(0));
                        }
                        else if (curMatFlags & AI_IRRMESH_MAT_normalmap_solid){
                            mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_NORMALS(0));
                        }
                        else if (curMatFlags & AI_IRRMESH_MAT_solid_2layer) {
                            mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_DIFFUSE(1));
                        }
                    }
                }
                else if (!ASSIMP_stricmp("tangents", t))    {
                    curTangents.reserve (num);
                    curBitangents.reserve (num);
                    vertexFormat = 2;
                }
                else if (ASSIMP_stricmp("standard", t)) {
                    releaseMaterial( &curMat );
                    ASSIMP_LOG_WARN("IRRMESH: Unknown vertex format");
                }
                else vertexFormat = 0;
                textMeaning = 1;
            }
            else if (!ASSIMP_stricmp(reader->getNodeName(),"indices"))  {
                if (curVertices.empty() && curMat)  {
                    releaseMaterial( &curMat );
                    throw DeadlyImportError("IRRMESH: indices must come after vertices");
                }

                textMeaning = 2;

                // start a new mesh
                curMesh = new aiMesh();

                // allocate storage for all faces
                curMesh->mNumVertices = reader->getAttributeValueAsInt("indexCount");
                if (!curMesh->mNumVertices) {
                    // This is possible ... remove the mesh from the list and skip further reading
                    ASSIMP_LOG_WARN("IRRMESH: Found mesh with zero indices");

                    // mesh - away
                    releaseMesh( &curMesh );

                    // material - away
                    releaseMaterial( &curMat );

                    textMeaning = 0;
                    continue;
                }

                if (curMesh->mNumVertices % 3)  {
                    ASSIMP_LOG_WARN("IRRMESH: Number if indices isn't divisible by 3");
                }

                curMesh->mNumFaces = curMesh->mNumVertices / 3;
                curMesh->mFaces = new aiFace[curMesh->mNumFaces];

                // setup some members
                curMesh->mMaterialIndex = (unsigned int)materials.size();
                curMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

                // allocate storage for all vertices
                curMesh->mVertices = new aiVector3D[curMesh->mNumVertices];

                if (curNormals.size() == curVertices.size())    {
                    curMesh->mNormals = new aiVector3D[curMesh->mNumVertices];
                }
                if (curTangents.size() == curVertices.size())   {
                    curMesh->mTangents = new aiVector3D[curMesh->mNumVertices];
                }
                if (curBitangents.size() == curVertices.size()) {
                    curMesh->mBitangents = new aiVector3D[curMesh->mNumVertices];
                }
                if (curColors.size() == curVertices.size() && useColors)    {
                    curMesh->mColors[0] = new aiColor4D[curMesh->mNumVertices];
                }
                if (curUVs.size() == curVertices.size())    {
                    curMesh->mTextureCoords[0] = new aiVector3D[curMesh->mNumVertices];
                }
                if (curUV2s.size() == curVertices.size())   {
                    curMesh->mTextureCoords[1] = new aiVector3D[curMesh->mNumVertices];
                }
            }
            break;

        case EXN_TEXT:
            {
            const char* sz = reader->getNodeData();
            if (textMeaning == 1)   {
                textMeaning = 0;

                // read vertices
                do  {
                    SkipSpacesAndLineEnd(&sz);
                    aiVector3D temp;aiColor4D c;

                    // Read the vertex position
                    sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                    SkipSpaces(&sz);
                    curVertices.push_back(temp);

                    // Read the vertex normals
                    sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                    SkipSpaces(&sz);
                    curNormals.push_back(temp);

                    // read the vertex colors
                    uint32_t clr = strtoul16(sz,&sz);
                    ColorFromARGBPacked(clr,c);

                    if (!curColors.empty() && c != *(curColors.end()-1))
                        useColors = true;

                    curColors.push_back(c);
                    SkipSpaces(&sz);


                    // read the first UV coordinate set
                    sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                    SkipSpaces(&sz);
                    temp.z = 0.f;
                    temp.y = 1.f - temp.y;  // DX to OGL
                    curUVs.push_back(temp);

                    // read the (optional) second UV coordinate set
                    if (vertexFormat == 1)  {
                        sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                        temp.y = 1.f - temp.y; // DX to OGL
                        curUV2s.push_back(temp);
                    }
                    // read optional tangent and bitangent vectors
                    else if (vertexFormat == 2) {
                        // tangents
                        sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                        SkipSpaces(&sz);
                        temp.y *= -1.0f;
                        curTangents.push_back(temp);

                        // bitangents
                        sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                        SkipSpaces(&sz);
                        temp.y *= -1.0f;
                        curBitangents.push_back(temp);
                    }
                }

                /* IMPORTANT: We assume that each vertex is specified in one
                   line. So we can skip the rest of the line - unknown vertex
                   elements are ignored.
                 */

                while (SkipLine(&sz));
            }
            else if (textMeaning == 2)  {
                textMeaning = 0;

                // read indices
                aiFace* curFace = curMesh->mFaces;
                aiFace* const faceEnd = curMesh->mFaces  + curMesh->mNumFaces;

                aiVector3D* pcV  = curMesh->mVertices;
                aiVector3D* pcN  = curMesh->mNormals;
                aiVector3D* pcT  = curMesh->mTangents;
                aiVector3D* pcB  = curMesh->mBitangents;
                aiColor4D* pcC0  = curMesh->mColors[0];
                aiVector3D* pcT0 = curMesh->mTextureCoords[0];
                aiVector3D* pcT1 = curMesh->mTextureCoords[1];

                unsigned int curIdx = 0;
                unsigned int total = 0;
                while(SkipSpacesAndLineEnd(&sz))    {
                    if (curFace >= faceEnd) {
                        ASSIMP_LOG_ERROR("IRRMESH: Too many indices");
                        break;
                    }
                    if (!curIdx)    {
                        curFace->mNumIndices = 3;
                        curFace->mIndices = new unsigned int[3];
                    }

                    unsigned int idx = strtoul10(sz,&sz);
                    if (idx >= curVertices.size())  {
                        ASSIMP_LOG_ERROR("IRRMESH: Index out of range");
                        idx = 0;
                    }

                    curFace->mIndices[curIdx] = total++;

                    *pcV++ = curVertices[idx];
                    if (pcN)*pcN++ = curNormals[idx];
                    if (pcT)*pcT++ = curTangents[idx];
                    if (pcB)*pcB++ = curBitangents[idx];
                    if (pcC0)*pcC0++ = curColors[idx];
                    if (pcT0)*pcT0++ = curUVs[idx];
                    if (pcT1)*pcT1++ = curUV2s[idx];

                    if (++curIdx == 3)  {
                        ++curFace;
                        curIdx = 0;
                    }
                }

                if (curFace != faceEnd)
                    ASSIMP_LOG_ERROR("IRRMESH: Not enough indices");

                // Finish processing the mesh - do some small material workarounds
                if (curMatFlags & AI_IRRMESH_MAT_trans_vertex_alpha && !useColors)  {
                    // Take the opacity value of the current material
                    // from the common vertex color alpha
                    aiMaterial* mat = (aiMaterial*)curMat;
                    mat->AddProperty(&curColors[0].a,1,AI_MATKEY_OPACITY);
                }
            }}
            break;

            default:
                // GCC complains here ...
                break;

        };
    }

    // End of the last buffer. A material and a mesh should be there
    if (curMat || curMesh)  {
        if ( !curMat || !curMesh)   {
            ASSIMP_LOG_ERROR("IRRMESH: A buffer must contain a mesh and a material");
            releaseMaterial( &curMat );
            releaseMesh( &curMesh );
        }
        else    {
            materials.push_back(curMat);
            meshes.push_back(curMesh);
        }
    }

    if (materials.empty())
        throw DeadlyImportError("IRRMESH: Unable to read a mesh from this file");


    // now generate the output scene
    pScene->mNumMeshes = (unsigned int)meshes.size();
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)    {
        pScene->mMeshes[i] = meshes[i];

        // clean this value ...
        pScene->mMeshes[i]->mNumUVComponents[3] = 0;
    }

    pScene->mNumMaterials = (unsigned int)materials.size();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    ::memcpy(pScene->mMaterials,&materials[0],sizeof(void*)*pScene->mNumMaterials);

    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("<IRRMesh>");
    pScene->mRootNode->mNumMeshes = pScene->mNumMeshes;
    pScene->mRootNode->mMeshes = new unsigned int[pScene->mNumMeshes];

    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
        pScene->mRootNode->mMeshes[i] = i;

    // clean up and return
    delete reader;
    AI_DEBUG_INVALIDATE_PTR(reader);
}